

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::InsertionOrderIndex::insertImpl(InsertionOrderIndex *this,size_t pos)

{
  uint uVar1;
  long lVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  undefined4 uVar4;
  Maybe<unsigned_long> MVar5;
  
  aVar3 = in_RDX;
  if (*(uint *)pos <= in_RDX.value) {
    reserve((InsertionOrderIndex *)pos,in_RDX.value + 1);
    aVar3 = extraout_RDX;
  }
  lVar2 = *(long *)(pos + 8);
  uVar1 = *(uint *)(lVar2 + 4);
  *(uint *)(lVar2 + 0xc + in_RDX.value * 8) = uVar1;
  *(undefined4 *)(lVar2 + 8 + in_RDX.value * 8) = 0;
  uVar4 = (undefined4)(in_RDX.value + 1);
  *(undefined4 *)(lVar2 + (ulong)uVar1 * 8) = uVar4;
  *(undefined4 *)(lVar2 + 4) = uVar4;
  *(undefined1 *)&this->capacity = 0;
  MVar5.ptr.field_1.value = aVar3.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar5.ptr;
}

Assistant:

kj::Maybe<size_t> InsertionOrderIndex::insertImpl(size_t pos) {
  if (pos >= capacity) {
    reserve(pos + 1);
  }

  links[pos + 1].prev = links[0].prev;
  links[pos + 1].next = 0;
  links[links[0].prev].next = pos + 1;
  links[0].prev = pos + 1;

  return nullptr;
}